

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator*(unsigned_long lhs,
         SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs)

{
  long *in_RSI;
  int64_t *unaff_retaddr;
  long ret;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff8;
  
  SafeInt::operator_cast_to_long
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)0x0);
  MultiplicationHelper<long,unsigned_long,15>::
  MultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (unaff_retaddr,(uint64_t *)in_stack_fffffffffffffff8.m_int,in_RSI);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff8,(long *)&stack0xffffffffffffffe0);
  return (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY SafeInt< T, E > operator *( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    T ret( 0 );
    MultiplicationHelper< T, U, MultiplicationMethod< T, U >::method >::template MultiplyThrow< E >( (T)rhs, lhs, ret );
    return SafeInt< T, E >(ret);
}